

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecmult_impl.h
# Opt level: O1

int secp256k1_ecmult_pippenger_batch
              (secp256k1_callback *error_callback,secp256k1_scratch *scratch,secp256k1_gej *r,
              secp256k1_scalar *inp_g_sc,secp256k1_ecmult_multi_callback *cb,void *cbdata,
              size_t n_points,size_t cb_offset)

{
  size_t __n;
  long lVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  byte bVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  uint uVar9;
  uint uVar10;
  long lVar11;
  secp256k1_ge *p1;
  secp256k1_scalar *s1;
  long *plVar12;
  void *pvVar13;
  ulong uVar14;
  secp256k1_gej *r_00;
  secp256k1_ge *psVar15;
  int iVar16;
  size_t checkpoint;
  long lVar17;
  secp256k1_scalar *psVar18;
  ulong uVar19;
  long lVar20;
  secp256k1_ge *psVar21;
  secp256k1_gej *psVar22;
  int *piVar23;
  ulong uVar24;
  long lVar25;
  long lVar26;
  byte bVar27;
  undefined1 auVar28 [16];
  size_t n_wnaf;
  secp256k1_gej running_sum;
  long local_140;
  long local_120;
  size_t local_108;
  undefined1 local_b8 [32];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  uint64_t local_48;
  int local_40;
  
  bVar27 = 0;
  lVar11 = 0;
  do {
    iVar16 = (uint)scratch->magic[lVar11] - (uint)(byte)"scratch"[lVar11];
    if (scratch->magic[lVar11] != "scratch"[lVar11]) goto LAB_0016b587;
    lVar11 = lVar11 + 1;
  } while (lVar11 != 8);
  iVar16 = 0;
LAB_0016b587:
  if (iVar16 == 0) {
    checkpoint = scratch->alloc_size;
  }
  else {
    (*error_callback->fn)("invalid scratch space",error_callback->data);
    checkpoint = 0;
  }
  r->infinity = 1;
  (r->x).n[0] = 0;
  (r->x).n[1] = 0;
  (r->x).n[2] = 0;
  (r->x).n[3] = 0;
  *(undefined1 (*) [16])((r->x).n + 4) = (undefined1  [16])0x0;
  (r->y).n[1] = 0;
  (r->y).n[2] = 0;
  (r->y).n[3] = 0;
  (r->y).n[4] = 0;
  (r->z).n[0] = 0;
  (r->z).n[1] = 0;
  (r->z).n[2] = 0;
  (r->z).n[3] = 0;
  (r->z).n[4] = 0;
  iVar16 = 1;
  if (inp_g_sc != (secp256k1_scalar *)0x0 || n_points != 0) {
    lVar11 = n_points * 2 + 2;
    local_108 = n_points;
    uVar9 = secp256k1_pippenger_bucket_window(n_points);
    p1 = (secp256k1_ge *)secp256k1_scratch_alloc(error_callback,scratch,lVar11 * 0x58);
    s1 = (secp256k1_scalar *)secp256k1_scratch_alloc(error_callback,scratch,lVar11 * 0x20);
    plVar12 = (long *)secp256k1_scratch_alloc(error_callback,scratch,0x10);
    if ((plVar12 == (long *)0x0 || s1 == (secp256k1_scalar *)0x0) || p1 == (secp256k1_ge *)0x0) {
LAB_0016b679:
      iVar16 = 0;
    }
    else {
      pvVar13 = secp256k1_scratch_alloc(error_callback,scratch,lVar11 * 0x10);
      plVar12[1] = (long)pvVar13;
      iVar16 = 0;
      uVar14 = (ulong)((int)(0x7f / (ulong)(uVar9 + 1)) + 1);
      pvVar13 = secp256k1_scratch_alloc(error_callback,scratch,lVar11 * uVar14 * 4);
      *plVar12 = (long)pvVar13;
      bVar5 = (byte)uVar9;
      r_00 = (secp256k1_gej *)
             secp256k1_scratch_alloc(error_callback,scratch,0x80L << (bVar5 & 0x3f));
      if ((plVar12[1] != 0) && (r_00 != (secp256k1_gej *)0x0 && *plVar12 != 0)) {
        if (inp_g_sc == (secp256k1_scalar *)0x0) {
          lVar11 = 0;
        }
        else {
          uVar6 = inp_g_sc->d[0];
          uVar7 = inp_g_sc->d[1];
          uVar8 = inp_g_sc->d[3];
          s1->d[2] = inp_g_sc->d[2];
          s1->d[3] = uVar8;
          s1->d[0] = uVar6;
          s1->d[1] = uVar7;
          psVar15 = &secp256k1_ge_const_g;
          psVar21 = p1;
          for (lVar11 = 0xb; lVar11 != 0; lVar11 = lVar11 + -1) {
            (psVar21->x).n[0] = (psVar15->x).n[0];
            psVar15 = (secp256k1_ge *)((long)psVar15 + ((ulong)bVar27 * -2 + 1) * 8);
            psVar21 = (secp256k1_ge *)((long)psVar21 + (ulong)bVar27 * -0x10 + 8);
          }
          secp256k1_ecmult_endo_split(s1,s1 + 1,p1,p1 + 1);
          lVar11 = 2;
        }
        if (n_points != 0) {
          psVar18 = (secp256k1_scalar *)((long)s1->d + (ulong)(uint)((int)lVar11 << 5));
          psVar15 = p1 + lVar11;
          do {
            iVar16 = (*cb)(psVar18,psVar15,cb_offset,cbdata);
            if (iVar16 == 0) goto LAB_0016b679;
            secp256k1_ecmult_endo_split(psVar18,psVar18 + 1,psVar15,psVar15 + 1);
            lVar11 = lVar11 + 2;
            cb_offset = cb_offset + 1;
            psVar18 = psVar18 + 2;
            psVar15 = psVar15 + 2;
            local_108 = local_108 - 1;
          } while (local_108 != 0);
        }
        if (lVar11 == 0) {
          local_140 = 0;
        }
        else {
          piVar23 = &p1->infinity;
          lVar25 = 0;
          local_140 = 0;
          psVar15 = p1;
          psVar18 = s1;
          do {
            auVar28._0_4_ = -(uint)((int)psVar18->d[2] == 0 && (int)psVar18->d[0] == 0);
            auVar28._4_4_ =
                 -(uint)(*(int *)((long)psVar18->d + 0x14) == 0 &&
                        *(int *)((long)psVar18->d + 4) == 0);
            auVar28._8_4_ = -(uint)((int)psVar18->d[3] == 0 && (int)psVar18->d[1] == 0);
            auVar28._12_4_ =
                 -(uint)(*(int *)((long)psVar18->d + 0x1c) == 0 &&
                        *(int *)((long)psVar18->d + 0xc) == 0);
            uVar10 = movmskps((int)psVar15,auVar28);
            psVar15 = (secp256k1_ge *)(ulong)(uVar10 ^ 0xf);
            if (((uVar10 ^ 0xf) != 0) && (*piVar23 == 0)) {
              *(long *)(plVar12[1] + 8 + local_140 * 0x10) = lVar25;
              uVar10 = secp256k1_wnaf_fixed
                                 ((int *)(local_140 * uVar14 * 4 + *plVar12),psVar18,uVar9 + 1);
              psVar15 = (secp256k1_ge *)(ulong)uVar10;
              *(uint *)(plVar12[1] + local_140 * 0x10) = uVar10;
              local_140 = local_140 + 1;
            }
            lVar25 = lVar25 + 1;
            piVar23 = piVar23 + 0x16;
            psVar18 = psVar18 + 1;
          } while (lVar11 != lVar25);
        }
        r->infinity = 1;
        (r->x).n[0] = 0;
        (r->x).n[1] = 0;
        (r->x).n[2] = 0;
        (r->x).n[3] = 0;
        *(undefined1 (*) [16])((r->x).n + 4) = (undefined1  [16])0x0;
        (r->y).n[1] = 0;
        (r->y).n[2] = 0;
        (r->y).n[3] = 0;
        (r->y).n[4] = 0;
        (r->z).n[0] = 0;
        (r->z).n[1] = 0;
        (r->z).n[2] = 0;
        (r->z).n[3] = 0;
        (r->z).n[4] = 0;
        if (local_140 != 0) {
          lVar20 = 1L << (bVar5 & 0x3f);
          auVar3._8_8_ = 0;
          auVar3._0_8_ = (ulong)uVar9 + 1;
          auVar3 = (ZEXT816(0) << 0x40 | ZEXT816(0x7f)) / auVar3;
          uVar19 = (ulong)(uint)(auVar3._0_4_ << 2);
          lVar25 = uVar19 + 4;
          uVar14 = (ulong)((int)lVar20 - 2);
          lVar17 = lVar20;
          psVar22 = r_00;
          local_120 = auVar3._0_8_;
          do {
            do {
              psVar22->infinity = 1;
              (psVar22->x).n[0] = 0;
              (psVar22->x).n[1] = 0;
              (psVar22->x).n[2] = 0;
              (psVar22->x).n[3] = 0;
              *(undefined1 (*) [16])((psVar22->x).n + 4) = (undefined1  [16])0x0;
              (psVar22->y).n[1] = 0;
              (psVar22->y).n[2] = 0;
              (psVar22->y).n[3] = 0;
              (psVar22->y).n[4] = 0;
              (psVar22->z).n[0] = 0;
              (psVar22->z).n[1] = 0;
              (psVar22->z).n[2] = 0;
              (psVar22->z).n[3] = 0;
              (psVar22->z).n[4] = 0;
              lVar17 = lVar17 + -1;
              psVar22 = psVar22 + 1;
            } while (lVar17 != 0);
            lVar26 = 8;
            lVar17 = local_140;
            uVar24 = uVar19;
            do {
              uVar10 = *(uint *)(*plVar12 + uVar24);
              lVar1 = *(long *)(plVar12[1] + lVar26);
              if ((local_120 == 0) && (*(int *)(plVar12[1] + -8 + lVar26) != 0)) {
                secp256k1_ge_neg((secp256k1_ge *)local_b8,p1 + lVar1);
                secp256k1_gej_add_ge_var(r_00,r_00,(secp256k1_ge *)local_b8,(secp256k1_fe *)0x0);
              }
              if ((int)uVar10 < 1) {
                if ((int)uVar10 < 0) {
                  uVar10 = ~uVar10;
                  psVar15 = (secp256k1_ge *)local_b8;
                  secp256k1_ge_neg(psVar15,p1 + lVar1);
                  goto LAB_0016ba2c;
                }
              }
              else {
                uVar10 = uVar10 - 1;
                psVar15 = p1 + lVar1;
LAB_0016ba2c:
                secp256k1_gej_add_ge_var
                          (r_00 + (uVar10 >> 1),r_00 + (uVar10 >> 1),psVar15,(secp256k1_fe *)0x0);
              }
              lVar26 = lVar26 + 0x10;
              uVar24 = uVar24 + lVar25;
              lVar17 = lVar17 + -1;
            } while (lVar17 != 0);
            uVar10 = uVar9;
            do {
              if (r->infinity == 0) {
                secp256k1_gej_double(r,r);
              }
              else {
                r->infinity = 1;
                (r->x).n[0] = 0;
                (r->x).n[1] = 0;
                (r->x).n[2] = 0;
                (r->x).n[3] = 0;
                *(undefined1 (*) [16])((r->x).n + 4) = (undefined1  [16])0x0;
                (r->y).n[1] = 0;
                (r->y).n[2] = 0;
                (r->y).n[3] = 0;
                (r->y).n[4] = 0;
                (r->z).n[0] = 0;
                (r->z).n[1] = 0;
                (r->z).n[2] = 0;
                (r->z).n[3] = 0;
                (r->z).n[4] = 0;
              }
              uVar10 = uVar10 - 1;
            } while (uVar10 != 0);
            local_40 = 1;
            local_b8._0_16_ = (undefined1  [16])0x0;
            local_b8._16_16_ = (undefined1  [16])0x0;
            local_98 = (undefined1  [16])0x0;
            local_88 = (undefined1  [16])0x0;
            local_78 = (undefined1  [16])0x0;
            local_68 = (undefined1  [16])0x0;
            local_58 = (undefined1  [16])0x0;
            local_48 = 0;
            lVar17 = uVar14 + 2;
            psVar22 = r_00 + uVar14 + 1;
            do {
              secp256k1_gej_add_var
                        ((secp256k1_gej *)local_b8,(secp256k1_gej *)local_b8,psVar22,
                         (secp256k1_fe *)0x0);
              secp256k1_gej_add_var(r,r,(secp256k1_gej *)local_b8,(secp256k1_fe *)0x0);
              lVar17 = lVar17 + -1;
              psVar22 = psVar22 + -1;
            } while (1 < lVar17);
            secp256k1_gej_add_var
                      ((secp256k1_gej *)local_b8,(secp256k1_gej *)local_b8,r_00,(secp256k1_fe *)0x0)
            ;
            if (r->infinity == 0) {
              secp256k1_gej_double(r,r);
            }
            else {
              r->infinity = 1;
              (r->x).n[0] = 0;
              (r->x).n[1] = 0;
              (r->x).n[2] = 0;
              (r->x).n[3] = 0;
              *(undefined1 (*) [16])((r->x).n + 4) = (undefined1  [16])0x0;
              (r->y).n[1] = 0;
              (r->y).n[2] = 0;
              (r->y).n[3] = 0;
              (r->y).n[4] = 0;
              (r->z).n[0] = 0;
              (r->z).n[1] = 0;
              (r->z).n[2] = 0;
              (r->z).n[3] = 0;
              (r->z).n[4] = 0;
            }
            secp256k1_gej_add_var(r,r,(secp256k1_gej *)local_b8,(secp256k1_fe *)0x0);
            uVar19 = uVar19 - 4;
            bVar2 = 0 < local_120;
            lVar17 = lVar20;
            psVar22 = r_00;
            local_120 = local_120 + -1;
          } while (bVar2);
        }
        if (lVar11 != 0) {
          lVar25 = 0;
          auVar4._8_8_ = 0;
          auVar4._0_8_ = (ulong)uVar9 + 1;
          __n = (ulong)SUB164((ZEXT816(0) << 0x40 | ZEXT816(0x7f)) / auVar4,0) * 4 + 4;
          lVar17 = 0;
          do {
            *(undefined1 (*) [16])((long)s1->d + lVar17 * 2 + 0x10) = (undefined1  [16])0x0;
            *(undefined1 (*) [16])((long)s1->d + lVar17 * 2) = (undefined1  [16])0x0;
            *(undefined4 *)(plVar12[1] + lVar17) = 0;
            memset((void *)(*plVar12 + lVar25),0,__n);
            lVar17 = lVar17 + 0x10;
            lVar25 = lVar25 + __n;
            lVar11 = lVar11 + -1;
          } while (lVar11 != 0);
        }
        iVar16 = 1;
        uVar9 = 1;
        do {
          *(undefined1 (*) [16])((long)(r_00->z).n + 0x1c) = (undefined1  [16])0x0;
          (r_00->z).n[2] = 0;
          (r_00->z).n[3] = 0;
          (r_00->z).n[0] = 0;
          (r_00->z).n[1] = 0;
          (r_00->y).n[3] = 0;
          (r_00->y).n[4] = 0;
          (r_00->y).n[1] = 0;
          (r_00->y).n[2] = 0;
          *(undefined1 (*) [16])((r_00->x).n + 4) = (undefined1  [16])0x0;
          (r_00->x).n[2] = 0;
          (r_00->x).n[3] = 0;
          (r_00->x).n[0] = 0;
          (r_00->x).n[1] = 0;
          r_00 = r_00 + 1;
          uVar10 = uVar9 >> (bVar5 & 0x1f);
          uVar9 = uVar9 + 1;
        } while (uVar10 == 0);
      }
    }
    secp256k1_scratch_apply_checkpoint(error_callback,scratch,checkpoint);
  }
  return iVar16;
}

Assistant:

static int secp256k1_ecmult_pippenger_batch(const secp256k1_callback* error_callback, secp256k1_scratch *scratch, secp256k1_gej *r, const secp256k1_scalar *inp_g_sc, secp256k1_ecmult_multi_callback cb, void *cbdata, size_t n_points, size_t cb_offset) {
    const size_t scratch_checkpoint = secp256k1_scratch_checkpoint(error_callback, scratch);
    /* Use 2(n+1) with the endomorphism, when calculating batch
     * sizes. The reason for +1 is that we add the G scalar to the list of
     * other scalars. */
    size_t entries = 2*n_points + 2;
    secp256k1_ge *points;
    secp256k1_scalar *scalars;
    secp256k1_gej *buckets;
    struct secp256k1_pippenger_state *state_space;
    size_t idx = 0;
    size_t point_idx = 0;
    int i, j;
    int bucket_window;

    secp256k1_gej_set_infinity(r);
    if (inp_g_sc == NULL && n_points == 0) {
        return 1;
    }
    bucket_window = secp256k1_pippenger_bucket_window(n_points);

    /* We allocate PIPPENGER_SCRATCH_OBJECTS objects on the scratch space. If
     * these allocations change, make sure to update the
     * PIPPENGER_SCRATCH_OBJECTS constant and pippenger_scratch_size
     * accordingly. */
    points = (secp256k1_ge *) secp256k1_scratch_alloc(error_callback, scratch, entries * sizeof(*points));
    scalars = (secp256k1_scalar *) secp256k1_scratch_alloc(error_callback, scratch, entries * sizeof(*scalars));
    state_space = (struct secp256k1_pippenger_state *) secp256k1_scratch_alloc(error_callback, scratch, sizeof(*state_space));
    if (points == NULL || scalars == NULL || state_space == NULL) {
        secp256k1_scratch_apply_checkpoint(error_callback, scratch, scratch_checkpoint);
        return 0;
    }
    state_space->ps = (struct secp256k1_pippenger_point_state *) secp256k1_scratch_alloc(error_callback, scratch, entries * sizeof(*state_space->ps));
    state_space->wnaf_na = (int *) secp256k1_scratch_alloc(error_callback, scratch, entries*(WNAF_SIZE(bucket_window+1)) * sizeof(int));
    buckets = (secp256k1_gej *) secp256k1_scratch_alloc(error_callback, scratch, ((size_t)1 << bucket_window) * sizeof(*buckets));
    if (state_space->ps == NULL || state_space->wnaf_na == NULL || buckets == NULL) {
        secp256k1_scratch_apply_checkpoint(error_callback, scratch, scratch_checkpoint);
        return 0;
    }

    if (inp_g_sc != NULL) {
        scalars[0] = *inp_g_sc;
        points[0] = secp256k1_ge_const_g;
        idx++;
        secp256k1_ecmult_endo_split(&scalars[0], &scalars[1], &points[0], &points[1]);
        idx++;
    }

    while (point_idx < n_points) {
        if (!cb(&scalars[idx], &points[idx], point_idx + cb_offset, cbdata)) {
            secp256k1_scratch_apply_checkpoint(error_callback, scratch, scratch_checkpoint);
            return 0;
        }
        idx++;
        secp256k1_ecmult_endo_split(&scalars[idx - 1], &scalars[idx], &points[idx - 1], &points[idx]);
        idx++;
        point_idx++;
    }

    secp256k1_ecmult_pippenger_wnaf(buckets, bucket_window, state_space, r, scalars, points, idx);

    /* Clear data */
    for(i = 0; (size_t)i < idx; i++) {
        secp256k1_scalar_clear(&scalars[i]);
        state_space->ps[i].skew_na = 0;
        for(j = 0; j < WNAF_SIZE(bucket_window+1); j++) {
            state_space->wnaf_na[i * WNAF_SIZE(bucket_window+1) + j] = 0;
        }
    }
    for(i = 0; i < 1<<bucket_window; i++) {
        secp256k1_gej_clear(&buckets[i]);
    }
    secp256k1_scratch_apply_checkpoint(error_callback, scratch, scratch_checkpoint);
    return 1;
}